

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_ml_table
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,table_type *t,
          table_format_info *fmt)

{
  basic_value<toml::type_config> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  _Hash_node_base *p_Var4;
  pointer pbVar5;
  pointer pcVar6;
  table_format_info *ptVar7;
  _Hash_node_base *p_Var8;
  array_format_info *paVar9;
  _Hash_node_base *p_Var10;
  bool bVar11;
  bool bVar12;
  string_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  table_format_info *local_48;
  table_type *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this->current_indent_ = this->current_indent_ + fmt->body_indent;
  p_Var10 = (t->_M_h)._M_before_begin._M_nxt;
  local_48 = fmt;
  local_40 = t;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    local_38 = &this->keys_;
    paVar2 = &local_70.field_2;
    do {
      pbVar1 = (basic_value<toml::type_config> *)(p_Var10 + 5);
      if (((*(char *)&p_Var10[5]._M_nxt == '\n') &&
          (ptVar7 = basic_value<toml::type_config>::as_table_fmt(pbVar1), ptVar7->fmt != oneline))
         && (ptVar7 = basic_value<toml::type_config>::as_table_fmt(pbVar1),
            ptVar7->fmt != multiline_oneline)) {
        ptVar7 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
        bVar11 = ptVar7->fmt != dotted;
      }
      else {
        bVar11 = false;
      }
      if (pbVar1->type_ == array) {
        p_Var8 = (p_Var10[6]._M_nxt)->_M_nxt;
        p_Var4 = p_Var10[6]._M_nxt[1]._M_nxt;
        if (p_Var8 != p_Var4) {
          cVar3 = *(char *)&p_Var8->_M_nxt;
          while (cVar3 == '\n') {
            p_Var8 = p_Var8 + 0x19;
            if (p_Var8 == p_Var4) {
              paVar9 = basic_value<toml::type_config>::as_array_fmt(pbVar1);
              if (paVar9->fmt != oneline) {
                paVar9 = basic_value<toml::type_config>::as_array_fmt(pbVar1);
                bVar12 = paVar9->fmt != multiline;
                goto LAB_003e7ec4;
              }
              break;
            }
            cVar3 = *(char *)&p_Var8->_M_nxt;
          }
        }
      }
      bVar12 = false;
LAB_003e7ec4:
      if (!(bool)(bVar11 | bVar12)) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,(value_type *)(p_Var10 + 1));
        format_comments_abi_cxx11_
                  (&local_70,this,(preserve_comments *)(p_Var10 + 0x1b),local_48->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        format_indent_abi_cxx11_(&local_70,this,local_48->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((pbVar1->type_ == table) &&
           (ptVar7 = basic_value<toml::type_config>::as_table_fmt(pbVar1), ptVar7->fmt == dotted)) {
          operator()[abi_cxx11_(&local_70,this,pbVar1);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          format_key(&local_70,this,(key_type *)(p_Var10 + 1));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          local_70._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," = ","");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          operator()[abi_cxx11_(&local_70,this,pbVar1);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'\n');
        }
        pbVar5 = (this->keys_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5 + -1;
        pcVar6 = pbVar5[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar5[-1].field_2) {
          operator_delete(pcVar6,pbVar5[-1].field_2._M_allocated_capacity + 1);
        }
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  this->current_indent_ = this->current_indent_ - local_48->body_indent;
  if (__return_storage_ptr__->_M_string_length != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'\n');
  }
  p_Var10 = (local_40->_M_h)._M_before_begin._M_nxt;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      pbVar1 = (basic_value<toml::type_config> *)(p_Var10 + 5);
      if (((*(char *)&p_Var10[5]._M_nxt == '\n') &&
          (ptVar7 = basic_value<toml::type_config>::as_table_fmt(pbVar1), ptVar7->fmt != oneline))
         && (ptVar7 = basic_value<toml::type_config>::as_table_fmt(pbVar1),
            ptVar7->fmt != multiline_oneline)) {
        ptVar7 = basic_value<toml::type_config>::as_table_fmt(pbVar1);
        bVar11 = ptVar7->fmt != dotted;
      }
      else {
        bVar11 = false;
      }
      if (pbVar1->type_ == array) {
        p_Var8 = (p_Var10[6]._M_nxt)->_M_nxt;
        p_Var4 = p_Var10[6]._M_nxt[1]._M_nxt;
        if (p_Var8 != p_Var4) {
          cVar3 = *(char *)&p_Var8->_M_nxt;
          while (cVar3 == '\n') {
            p_Var8 = p_Var8 + 0x19;
            if (p_Var8 == p_Var4) {
              paVar9 = basic_value<toml::type_config>::as_array_fmt(pbVar1);
              if (paVar9->fmt != oneline) {
                paVar9 = basic_value<toml::type_config>::as_array_fmt(pbVar1);
                bVar12 = paVar9->fmt != multiline;
                goto LAB_003e817d;
              }
              break;
            }
            cVar3 = *(char *)&p_Var8->_M_nxt;
          }
        }
      }
      bVar12 = false;
LAB_003e817d:
      if ((bool)(bVar11 | bVar12)) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&this->keys_,(value_type *)(p_Var10 + 1));
        operator()[abi_cxx11_(&local_70,this,pbVar1);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,local_70._M_dataplus._M_p,local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pbVar5 = (this->keys_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5 + -1;
        pcVar6 = pbVar5[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar5[-1].field_2) {
          operator_delete(pcVar6,pbVar5[-1].field_2._M_allocated_capacity + 1);
        }
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type format_ml_table(const table_type& t, const table_format_info& fmt) // {{{
    {
        const auto format_later = [](const value_type& v) -> bool {

            const bool is_ml_table = v.is_table() &&
                v.as_table_fmt().fmt != table_format::oneline           &&
                v.as_table_fmt().fmt != table_format::multiline_oneline &&
                v.as_table_fmt().fmt != table_format::dotted ;

            const bool is_ml_array_table = v.is_array_of_tables() &&
                v.as_array_fmt().fmt != array_format::oneline &&
                v.as_array_fmt().fmt != array_format::multiline;

            return is_ml_table || is_ml_array_table;
        };

        string_type retval;
        this->current_indent_ += fmt.body_indent;
        for(const auto& kv : t)
        {
            const auto& key = kv.first;
            const auto& val = kv.second;
            if(format_later(val))
            {
                continue;
            }
            this->keys_.push_back(key);

            retval += format_comments(val.comments(), fmt.indent_type);
            retval += format_indent(fmt.indent_type);
            if(val.is_table() && val.as_table_fmt().fmt == table_format::dotted)
            {
                retval += (*this)(val);
            }
            else
            {
                retval += format_key(key);
                retval += string_conv<string_type>(" = ");
                retval += (*this)(val);
                retval += char_type('\n');
            }
            this->keys_.pop_back();
        }
        this->current_indent_ -= fmt.body_indent;

        if( ! retval.empty())
        {
            retval += char_type('\n'); // for readability, add empty line between tables
        }
        for(const auto& kv : t)
        {
            if( ! format_later(kv.second))
            {
                continue;
            }
            // must be a [multiline.table] or [[multiline.array.of.tables]].
            // comments will be generated inside it.
            this->keys_.push_back(kv.first);
            retval += (*this)(kv.second);
            this->keys_.pop_back();
        }
        return retval;
    }